

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

Stream * __thiscall
kratos::Stream::operator<<
          (Stream *this,
          pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *port)

{
  undefined1 *puVar1;
  ostream *poVar2;
  Port *port_00;
  string_view sVar3;
  string local_48;
  
  if ((port->first->super_Var).super_IRNode.comment._M_string_length != 0) {
    sVar3 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->super_stringstream).field_0x10,sVar3._M_str,sVar3._M_len)
    ;
    poVar2 = std::operator<<(poVar2,"// ");
    strip_newline(&local_48,&(port->first->super_Var).super_IRNode.comment);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    puVar1 = &(this->super_stringstream).field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (port->first->super_Var).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->super_stringstream).field_0x90;
  }
  sVar3 = SystemVerilogCodeGen::indent
                    (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->super_stringstream).field_0x10,sVar3._M_str,sVar3._M_len);
  poVar2 = std::operator<<(poVar2,(string *)&(port->first->super_Var).before_var_str_);
  SystemVerilogCodeGen::get_port_str_abi_cxx11_
            (&local_48,(SystemVerilogCodeGen *)port->first,port_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&(port->first->super_Var).after_var_str_);
  poVar2 = std::operator<<(poVar2,(string *)&port->second);
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_48);
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::pair<Port*, std::string>& port) {
    const auto& [p, end] = port;
    if (!p->comment.empty())
        (*this) << codegen_->indent() << "// " << strip_newline(p->comment) << endl();
    if (generator_->debug) {
        p->verilog_ln = line_no_;
    }

    (*this) << codegen_->indent() << p->before_var_str() << SystemVerilogCodeGen::get_port_str(p)
            << p->after_var_str() << end << endl();

    return *this;
}